

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Viper.cpp
# Opt level: O0

void __thiscall chrono::viper::ViperPart::Construct(ViperPart *this,ChSystem *system)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  ChSystem *pCVar2;
  ChBodyAuxRef *__p;
  element_type *peVar3;
  element_type *peVar4;
  ChVector<double> *pCVar5;
  ChMatrix33<double> *pCVar6;
  element_type *peVar7;
  element_type *peVar8;
  shared_ptr<chrono::ChBody> local_390;
  shared_ptr<chrono::collision::ChCollisionModel> local_380;
  ChMatrix33<double> local_370;
  shared_ptr<chrono::geometry::ChTriangleMesh> local_328;
  shared_ptr<chrono::ChMaterialSurface> local_318;
  shared_ptr<chrono::collision::ChCollisionModel> local_308;
  shared_ptr<chrono::collision::ChCollisionModel> local_2f8;
  ChMatrix33<double> local_2e8;
  ChVector<double> local_2a0;
  undefined1 local_288 [8];
  shared_ptr<chrono::geometry::ChTriangleMeshConnected> trimesh_col;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258 [32];
  string local_238 [8];
  string col_mesh_file;
  ChQuaternion<double> local_218;
  ChVector<double> local_1f8;
  ChFrame<double> local_1e0;
  shared_ptr<chrono::ChVisualShape> local_158;
  shared_ptr<chrono::geometry::ChTriangleMeshConnected> local_148;
  undefined1 local_138 [8];
  shared_ptr<chrono::ChTriangleMeshShape> trimesh_shape;
  ChVector<double> local_e0;
  undefined1 local_c8 [8];
  shared_ptr<chrono::geometry::ChTriangleMeshConnected> trimesh_vis;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98 [32];
  string local_78 [8];
  string vis_mesh_file;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48 [32];
  shared_ptr<chrono::ChBodyAuxRef> local_28;
  ChSystem *local_18;
  ChSystem *system_local;
  ViperPart *this_local;
  
  local_18 = system;
  system_local = (ChSystem *)this;
  __p = (ChBodyAuxRef *)(**(code **)(*(long *)system + 0x188))();
  std::shared_ptr<chrono::ChBodyAuxRef>::shared_ptr<chrono::ChBodyAuxRef,void>(&local_28,__p);
  std::shared_ptr<chrono::ChBodyAuxRef>::operator=(&this->m_body,&local_28);
  std::shared_ptr<chrono::ChBodyAuxRef>::~shared_ptr(&local_28);
  peVar3 = std::__shared_ptr_access<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->m_body);
  std::operator+(local_48,(char *)&this->m_name);
  ChObj::SetNameString((ChObj *)peVar3,local_48);
  std::__cxx11::string::~string((string *)local_48);
  peVar3 = std::__shared_ptr_access<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->m_body);
  ChBody::SetMass((ChBody *)peVar3,this->m_mass);
  peVar3 = std::__shared_ptr_access<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->m_body);
  chrono::ChBody::SetInertiaXX(peVar3);
  peVar3 = std::__shared_ptr_access<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->m_body);
  chrono::ChBodyAuxRef::SetFrame_COG_to_REF((ChFrame *)peVar3);
  if ((this->m_visualize & 1U) != 0) {
    p_Var1 = &trimesh_vis.
              super___shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount;
    std::operator+((char *)p_Var1,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   "robot/viper/obj/");
    std::operator+(local_98,(char *)p_Var1);
    chrono::GetChronoDataFile(local_78);
    std::__cxx11::string::~string((string *)local_98);
    std::__cxx11::string::~string
              ((string *)
               &trimesh_vis.
                super___shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
    chrono::geometry::ChTriangleMeshConnected::CreateFromWavefrontFile
              ((string *)local_c8,SUB81(local_78,0),true);
    peVar4 = std::
             __shared_ptr_access<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_c8);
    pCVar5 = ChFrame<double>::GetPos(&this->m_mesh_xform);
    ChVector<double>::ChVector(&local_e0,pCVar5);
    pCVar6 = ChFrame<double>::GetA(&this->m_mesh_xform);
    ChMatrix33<double>::ChMatrix33
              ((ChMatrix33<double> *)
               &trimesh_shape.
                super___shared_ptr<chrono::ChTriangleMeshShape,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,pCVar6);
    (**(code **)(*(long *)peVar4 + 0x80))
              (peVar4,&local_e0,
               &trimesh_shape.
                super___shared_ptr<chrono::ChTriangleMeshShape,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::
    __shared_ptr_access<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)local_c8);
    chrono::geometry::ChTriangleMeshConnected::RepairDuplicateVertexes(1e-09);
    chrono_types::make_shared<chrono::ChTriangleMeshShape,_0>();
    peVar7 = std::
             __shared_ptr_access<chrono::ChTriangleMeshShape,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<chrono::ChTriangleMeshShape,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_138);
    std::shared_ptr<chrono::geometry::ChTriangleMeshConnected>::shared_ptr
              (&local_148,(shared_ptr<chrono::geometry::ChTriangleMeshConnected> *)local_c8);
    chrono::ChTriangleMeshShape::SetMesh(peVar7,&local_148,1);
    std::shared_ptr<chrono::geometry::ChTriangleMeshConnected>::~shared_ptr(&local_148);
    peVar7 = std::
             __shared_ptr_access<chrono::ChTriangleMeshShape,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<chrono::ChTriangleMeshShape,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_138);
    ChTriangleMeshShape::SetName(peVar7,&this->m_mesh_name);
    peVar7 = std::
             __shared_ptr_access<chrono::ChTriangleMeshShape,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<chrono::ChTriangleMeshShape,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_138);
    ChVisualShape::SetMutable((ChVisualShape *)peVar7,false);
    peVar3 = std::
             __shared_ptr_access<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->m_body);
    std::shared_ptr<chrono::ChVisualShape>::shared_ptr<chrono::ChTriangleMeshShape,void>
              (&local_158,(shared_ptr<chrono::ChTriangleMeshShape> *)local_138);
    ChVector<double>::ChVector(&local_1f8,0.0,0.0,0.0);
    ChQuaternion<double>::ChQuaternion(&local_218,1.0,0.0,0.0,0.0);
    ChFrame<double>::ChFrame(&local_1e0,&local_1f8,&local_218);
    chrono::ChPhysicsItem::AddVisualShape(peVar3,&local_158,&local_1e0);
    ChFrame<double>::~ChFrame(&local_1e0);
    std::shared_ptr<chrono::ChVisualShape>::~shared_ptr(&local_158);
    std::shared_ptr<chrono::ChTriangleMeshShape>::~shared_ptr
              ((shared_ptr<chrono::ChTriangleMeshShape> *)local_138);
    std::shared_ptr<chrono::geometry::ChTriangleMeshConnected>::~shared_ptr
              ((shared_ptr<chrono::geometry::ChTriangleMeshConnected> *)local_c8);
    std::__cxx11::string::~string(local_78);
  }
  if ((this->m_collide & 1U) != 0) {
    p_Var1 = &trimesh_col.
              super___shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount;
    std::operator+((char *)p_Var1,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   "robot/viper/col/");
    std::operator+(local_258,(char *)p_Var1);
    chrono::GetChronoDataFile(local_238);
    std::__cxx11::string::~string((string *)local_258);
    std::__cxx11::string::~string
              ((string *)
               &trimesh_col.
                super___shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
    chrono::geometry::ChTriangleMeshConnected::CreateFromWavefrontFile
              ((string *)local_288,SUB81(local_238,0),false);
    peVar4 = std::
             __shared_ptr_access<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_288);
    pCVar5 = ChFrame<double>::GetPos(&this->m_mesh_xform);
    ChVector<double>::ChVector(&local_2a0,pCVar5);
    pCVar6 = ChFrame<double>::GetA(&this->m_mesh_xform);
    ChMatrix33<double>::ChMatrix33(&local_2e8,pCVar6);
    (**(code **)(*(long *)peVar4 + 0x80))(peVar4,&local_2a0,&local_2e8);
    std::
    __shared_ptr_access<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)local_288);
    chrono::geometry::ChTriangleMeshConnected::RepairDuplicateVertexes(1e-09);
    std::__shared_ptr_access<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)&this->m_body);
    ChBody::GetCollisionModel((ChBody *)&local_2f8);
    peVar8 = std::
             __shared_ptr_access<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&local_2f8);
    (**(code **)(*(long *)peVar8 + 0x18))();
    std::shared_ptr<chrono::collision::ChCollisionModel>::~shared_ptr(&local_2f8);
    std::__shared_ptr_access<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)&this->m_body);
    ChBody::GetCollisionModel((ChBody *)&local_308);
    peVar8 = std::
             __shared_ptr_access<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&local_308);
    std::shared_ptr<chrono::ChMaterialSurface>::shared_ptr(&local_318,&this->m_mat);
    std::shared_ptr<chrono::geometry::ChTriangleMesh>::
    shared_ptr<chrono::geometry::ChTriangleMeshConnected,void>
              (&local_328,(shared_ptr<chrono::geometry::ChTriangleMeshConnected> *)local_288);
    ChMatrix33<double>::ChMatrix33(&local_370,1.0);
    (**(code **)(*(long *)peVar8 + 0x80))
              (0x3f747ae147ae147b,peVar8,&local_318,&local_328,0,0,&VNULL,&local_370);
    std::shared_ptr<chrono::geometry::ChTriangleMesh>::~shared_ptr(&local_328);
    std::shared_ptr<chrono::ChMaterialSurface>::~shared_ptr(&local_318);
    std::shared_ptr<chrono::collision::ChCollisionModel>::~shared_ptr(&local_308);
    std::__shared_ptr_access<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)&this->m_body);
    ChBody::GetCollisionModel((ChBody *)&local_380);
    peVar8 = std::
             __shared_ptr_access<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&local_380);
    (**(code **)(*(long *)peVar8 + 0x20))();
    std::shared_ptr<chrono::collision::ChCollisionModel>::~shared_ptr(&local_380);
    peVar3 = std::
             __shared_ptr_access<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->m_body);
    chrono::ChBody::SetCollide(SUB81(peVar3,0));
    std::shared_ptr<chrono::geometry::ChTriangleMeshConnected>::~shared_ptr
              ((shared_ptr<chrono::geometry::ChTriangleMeshConnected> *)local_288);
    std::__cxx11::string::~string(local_238);
  }
  pCVar2 = local_18;
  std::shared_ptr<chrono::ChBody>::shared_ptr<chrono::ChBodyAuxRef,void>(&local_390,&this->m_body);
  (**(code **)(*(long *)pCVar2 + 0x128))(pCVar2,&local_390);
  std::shared_ptr<chrono::ChBody>::~shared_ptr(&local_390);
  return;
}

Assistant:

void ViperPart::Construct(ChSystem* system) {
    m_body = std::shared_ptr<ChBodyAuxRef>(system->NewBodyAuxRef());
    m_body->SetNameString(m_name + "_body");
    m_body->SetMass(m_mass);
    m_body->SetInertiaXX(m_inertia);
    m_body->SetFrame_COG_to_REF(m_cog);

    // Add visualization shape
    if (m_visualize) {
        auto vis_mesh_file = GetChronoDataFile("robot/viper/obj/" + m_mesh_name + ".obj");
        auto trimesh_vis = geometry::ChTriangleMeshConnected::CreateFromWavefrontFile(vis_mesh_file, true, true);
        trimesh_vis->Transform(m_mesh_xform.GetPos(), m_mesh_xform.GetA());  // translate/rotate/scale mesh
        trimesh_vis->RepairDuplicateVertexes(1e-9);                          // if meshes are not watertight

        auto trimesh_shape = chrono_types::make_shared<ChTriangleMeshShape>();
        trimesh_shape->SetMesh(trimesh_vis);
        trimesh_shape->SetName(m_mesh_name);
        trimesh_shape->SetMutable(false);
        m_body->AddVisualShape(trimesh_shape);
    }

    // Add collision shape
    if (m_collide) {
        auto col_mesh_file = GetChronoDataFile("robot/viper/col/" + m_mesh_name + ".obj");
        auto trimesh_col = geometry::ChTriangleMeshConnected::CreateFromWavefrontFile(col_mesh_file, false, false);
        trimesh_col->Transform(m_mesh_xform.GetPos(), m_mesh_xform.GetA());  // translate/rotate/scale mesh
        trimesh_col->RepairDuplicateVertexes(1e-9);                          // if meshes are not watertight

        m_body->GetCollisionModel()->ClearModel();
        m_body->GetCollisionModel()->AddTriangleMesh(m_mat, trimesh_col, false, false, VNULL, ChMatrix33<>(1), 0.005);
        m_body->GetCollisionModel()->BuildModel();
        m_body->SetCollide(m_collide);
    }

    system->AddBody(m_body);
}